

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlValidateUtf8(xmlParserCtxtPtr ctxt,xmlChar *str,size_t len,int partial)

{
  byte bVar1;
  uint3 uVar2;
  uint uVar3;
  uint v_1;
  uint v;
  int size;
  uint c;
  int partial_local;
  size_t len_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  bVar1 = *str;
  if (0xc1 < bVar1) {
    if (bVar1 < 0xe0) {
      if (1 < len) {
        if ((str[1] & 0xc0) == 0x80) {
          return 2;
        }
        goto LAB_00197528;
      }
    }
    else if (bVar1 < 0xf0) {
      if (2 < len) {
        uVar2 = CONCAT12(bVar1,CONCAT11(str[1],str[2]));
        if ((((CONCAT11(str[1],str[2]) & 0xc0c0) == 0x8080) && ((uVar2 & 0xf2000) != 0)) &&
           ((uVar2 & 0xf2000) != 0xd2000)) {
          return 3;
        }
        goto LAB_00197528;
      }
    }
    else if (3 < len) {
      uVar3 = (uint)bVar1 << 0x18 | (uint)str[1] << 0x10 | (uint)str[2] << 8 | (uint)str[3];
      if ((((uVar3 & 0xc0c0c0) == 0x808080) && (0xf08fffff < uVar3)) && (uVar3 < 0xf4900000)) {
        return 4;
      }
      goto LAB_00197528;
    }
    if (partial != 0) {
      return 0;
    }
  }
LAB_00197528:
  if ((ctxt->input->flags & 0x20U) == 0) {
    htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"Invalid bytes in character encoding",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    ctxt->input->flags = ctxt->input->flags | 0x20;
  }
  return -1;
}

Assistant:

static int
htmlValidateUtf8(xmlParserCtxtPtr ctxt, const xmlChar *str, size_t len,
                 int partial) {
    unsigned c = str[0];
    int size;

    if (c < 0xC2) {
        goto invalid;
    } else if (c < 0xE0) {
        if (len < 2)
            goto incomplete;
        if ((str[1] & 0xC0) != 0x80)
            goto invalid;
        size = 2;
    } else if (c < 0xF0) {
        unsigned v;

        if (len < 3)
            goto incomplete;

        v = str[1] << 8 | str[2]; /* hint to generate 16-bit load */
        v |= c << 16;

        if (((v & 0x00C0C0) != 0x008080) ||
            ((v & 0x0F2000) == 0x000000) ||
            ((v & 0x0F2000) == 0x0D2000))
            goto invalid;

        size = 3;
    } else {
        unsigned v;

        if (len < 4)
            goto incomplete;

        v = c << 24 | str[1] << 16 | str[2] << 8 | str[3];

        if (((v & 0x00C0C0C0) != 0x00808080) ||
            (v < 0xF0900000) || (v >= 0xF4900000))
            goto invalid;

        size = 4;
    }

    return(size);

incomplete:
    if (partial)
        return(0);

invalid:
    /* Only report the first error */
    if ((ctxt->input->flags & XML_INPUT_ENCODING_ERROR) == 0) {
        htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
                     "Invalid bytes in character encoding", NULL, NULL);
        ctxt->input->flags |= XML_INPUT_ENCODING_ERROR;
    }

    return(-1);
}